

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CopyLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_copy(NeuralNetworkLayer *this)

{
  bool bVar1;
  CopyLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_copy(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_copy(this);
    this_00 = (CopyLayerParams *)operator_new(0x18);
    CopyLayerParams::CopyLayerParams(this_00);
    (this->layer_).copy_ = this_00;
  }
  return (CopyLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CopyLayerParams* NeuralNetworkLayer::mutable_copy() {
  if (!has_copy()) {
    clear_layer();
    set_has_copy();
    layer_.copy_ = new ::CoreML::Specification::CopyLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.copy)
  return layer_.copy_;
}